

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1TupleType<int,4ul>
          (AsciiParser *this,char sep,
          vector<nonstd::optional_lite::optional<std::array<int,_4UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<int,_4UL>_>_>_>
          *result)

{
  bool bVar1;
  StreamReader *pSVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  char c;
  array<int,_4UL> value;
  char local_61;
  string local_60;
  array<int,_4UL> local_40;
  
  if (*(long *)(result + 8) != *(long *)result) {
    *(long *)(result + 8) = *(long *)result;
  }
  bVar1 = SkipWhitespaceAndNewline(this,true);
  if (!bVar1) {
    return false;
  }
  bVar1 = MaybeNone(this);
  if (bVar1) {
    local_60._M_dataplus._M_p._0_4_ = (uint)local_60._M_dataplus._M_p & 0xffffff00;
    local_60._M_dataplus._M_p._4_4_ = 0;
    local_60._M_string_length._0_4_ = 0;
    local_60._M_string_length._4_4_ = 0;
    local_60.field_2._M_allocated_capacity._0_4_ = 0;
  }
  else {
    bVar1 = ParseBasicTypeTuple<int,4ul>(this,&local_40);
    if (!bVar1) {
      pcVar5 = "Not starting with the tuple value of requested type.\n";
      pcVar4 = "";
      goto LAB_003ae376;
    }
    local_60._M_dataplus._M_p._0_1_ = 1;
    local_60._M_dataplus._M_p._4_4_ = local_40._M_elems[0];
    local_60._M_string_length._0_4_ = local_40._M_elems[1];
    local_60._M_string_length._4_4_ = local_40._M_elems[2];
    local_60.field_2._M_allocated_capacity._0_4_ = local_40._M_elems[3];
  }
  ::std::
  vector<nonstd::optional_lite::optional<std::array<int,4ul>>,std::allocator<nonstd::optional_lite::optional<std::array<int,4ul>>>>
  ::emplace_back<nonstd::optional_lite::optional<std::array<int,4ul>>>
            ((vector<nonstd::optional_lite::optional<std::array<int,4ul>>,std::allocator<nonstd::optional_lite::optional<std::array<int,4ul>>>>
              *)result,(optional<std::array<int,_4UL>_> *)&local_60);
  pSVar2 = this->_sr;
  uVar3 = pSVar2->idx_;
  if (uVar3 < pSVar2->length_) {
    while (pSVar2->binary_[uVar3] != '\0') {
      bVar1 = SkipWhitespaceAndNewline(this,true);
      if (!bVar1) {
        return false;
      }
      bVar1 = Char1(this,&local_61);
      if (!bVar1) {
        return false;
      }
      if (local_61 != sep) {
        pSVar2 = this->_sr;
        if ((0 < (long)pSVar2->idx_) && (uVar3 = pSVar2->idx_ - 1, uVar3 <= pSVar2->length_)) {
          pSVar2->idx_ = uVar3;
        }
        break;
      }
      bVar1 = SkipWhitespaceAndNewline(this,true);
      if (!bVar1) {
        return false;
      }
      bVar1 = MaybeNone(this);
      if (bVar1) {
        local_60._M_dataplus._M_p._0_4_ = (uint)local_60._M_dataplus._M_p & 0xffffff00;
        local_60._M_dataplus._M_p._4_4_ = 0;
        local_60._M_string_length._0_4_ = 0;
        local_60._M_string_length._4_4_ = 0;
        local_60.field_2._M_allocated_capacity._0_4_ = 0;
      }
      else {
        bVar1 = ParseBasicTypeTuple<int,4ul>(this,&local_40);
        if (!bVar1) break;
        local_60._M_dataplus._M_p._0_1_ = 1;
        local_60._M_dataplus._M_p._4_4_ = local_40._M_elems[0];
        local_60._M_string_length._0_4_ = local_40._M_elems[1];
        local_60._M_string_length._4_4_ = local_40._M_elems[2];
        local_60.field_2._M_allocated_capacity._0_4_ = local_40._M_elems[3];
      }
      ::std::
      vector<nonstd::optional_lite::optional<std::array<int,4ul>>,std::allocator<nonstd::optional_lite::optional<std::array<int,4ul>>>>
      ::emplace_back<nonstd::optional_lite::optional<std::array<int,4ul>>>
                ((vector<nonstd::optional_lite::optional<std::array<int,4ul>>,std::allocator<nonstd::optional_lite::optional<std::array<int,4ul>>>>
                  *)result,(optional<std::array<int,_4UL>_> *)&local_60);
      pSVar2 = this->_sr;
      uVar3 = pSVar2->idx_;
      if (pSVar2->length_ <= uVar3) break;
    }
  }
  if (*(long *)result != *(long *)(result + 8)) {
    return true;
  }
  pcVar5 = "Empty array.\n";
  pcVar4 = "";
LAB_003ae376:
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,pcVar5,pcVar4);
  PushError(this,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT44(local_60.field_2._M_allocated_capacity._4_4_,
                             local_60.field_2._M_allocated_capacity._0_4_) + 1);
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1TupleType(
    const char sep, std::vector<nonstd::optional<std::array<T, N>>> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  if (MaybeNone()) {
    result->push_back(nonstd::nullopt);
  } else {
    std::array<T, N> value;
    if (!ParseBasicTypeTuple<T, N>(&value)) {
      PushError("Not starting with the tuple value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    if (MaybeNone()) {
      result->push_back(nonstd::nullopt);
    } else {
      std::array<T, N> value;
      if (!ParseBasicTypeTuple<T, N>(&value)) {
        break;
      }
      result->push_back(value);
    }
  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}